

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Object::stAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  undefined4 extraout_var_02;
  Oop value;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar5;
  uint64_t uVar6;
  Oop *oopData;
  uint8_t *puVar7;
  long lVar8;
  Oop self;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar1));
  iVar1 = stSize(interpreter);
  if (iVar1 != 0) {
    return iVar1;
  }
  aVar4._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  aVar4.uintValue._4_4_ = extraout_var_01;
  local_38 = aVar4;
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  value.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  value.field_0.uintValue._4_4_ = extraout_var_03;
  uVar3 = (*interpreter->_vptr_InterpreterProxy[6])(interpreter);
  if (((uVar3 & 1) == 0) || ((uVar2 & 1) == 0)) {
    __assert_fail("isSmallInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
  }
  lVar8 = CONCAT44(extraout_var_02,uVar2) >> 1;
  if ((lVar8 < 1) || (CONCAT44(extraout_var_04,uVar3) >> 1 < lVar8 + -1)) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  if ((aVar4._0_4_ & 7) == 0) {
    sVar5 = Oop::getFixedSlotCount((Oop *)&local_38,(VMContext *)CONCAT44(extraout_var_05,iVar1));
    puVar7 = aVar4.pointer + sVar5 * 8 + 8;
    aVar4 = local_38;
  }
  else {
    puVar7 = (uint8_t *)0x0;
  }
  uVar2 = (uint)((ulong)*(undefined8 *)aVar4.pointer >> 0x23) & 0x1f;
  if (uVar2 < 9) {
    ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar7 + lVar8 * 8 + -8))->uintValue =
         (uintptr_t)value.field_0;
  }
  else if (uVar2 < 0x10) {
    if (uVar2 < 0xc) {
      if (uVar2 == 9) {
        uVar6 = VMContext::positiveInt64ValueOf((VMContext *)CONCAT44(extraout_var_05,iVar1),value);
        *(uint64_t *)(puVar7 + lVar8 * 8 + -8) = uVar6;
      }
      else {
        if ((value.field_0._0_4_ & 1) == 0) goto LAB_0013f918;
        *(int *)(puVar7 + lVar8 * 4 + -4) = (int)((ulong)value.field_0 >> 1);
      }
    }
    else {
      if ((value.field_0._0_4_ & 1) == 0) goto LAB_0013f918;
      *(short *)(puVar7 + lVar8 * 2 + -2) = (short)(value.field_0._0_4_ >> 1);
    }
  }
  else {
    if ((value.field_0._0_4_ & 1) == 0) {
LAB_0013f918:
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
      return iVar1;
    }
    puVar7[lVar8 + -1] = (uint8_t)(value.field_0._0_4_ >> 1);
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,value.field_0);
  return iVar1;
}

Assistant:

int Object::stAtPut(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    auto self = interpreter->getReceiver();
    auto indexOop = interpreter->getTemporary(0);
    auto value = interpreter->getTemporary(1);
	auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Set the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        oopData[index] = value;
    }
    else if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint8_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint16_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint32_t)value.decodeSmallInteger();
#else
        data[index] = (uint32_t)context->positiveInt32ValueOf(value);
#endif
    }
    else if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        data[index] = context->positiveInt64ValueOf(value);
    }
    else
    {
    	nativeError("unimplemented");
    }

    return interpreter->returnOop(value);
}